

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall hypermind::Lexer::Consume(Lexer *this,TokenType type)

{
  TokenType TVar1;
  TokenType type_local;
  Lexer *this_local;
  
  TVar1 = PeekTokenType(this);
  if (TVar1 == type) {
    Consume(this);
  }
  else {
    std::operator<<((ostream *)&std::cout," missing token :  ");
    DumpTokenType((Ostream *)&std::cout,type);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Lexer::Consume(TokenType type) {
        if (PeekTokenType() == type)
            Consume();
        else {
            hm_cout << _HM_C(" missing token :  ");
            DumpTokenType(hm_cout, type);
            hm_cout << std::endl;
        }
    }